

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamRedirect::StreamRedirect(StreamRedirect *this,ostream *stream,string *targetString)

{
  long lVar1;
  streambuf *psVar2;
  string *targetString_local;
  ostream *stream_local;
  StreamRedirect *this_local;
  
  this->m_stream = stream;
  psVar2 = (streambuf *)std::ios::rdbuf();
  this->m_prevBuf = psVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_oss);
  this->m_targetString = targetString;
  lVar1 = *(long *)(*(long *)stream + -0x18);
  std::__cxx11::ostringstream::rdbuf();
  std::ios::rdbuf((streambuf *)(stream + lVar1));
  return;
}

Assistant:

StreamRedirect( std::ostream& stream, std::string& targetString )
        :   m_stream( stream ),
            m_prevBuf( stream.rdbuf() ),
            m_targetString( targetString )
        {
            stream.rdbuf( m_oss.rdbuf() );
        }